

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O2

void message_adddollar(t_message *x,t_floatarg f)

{
  t_atom a;
  
  a.a_w.w_float = 0.0;
  if (0 < (int)f) {
    a.a_w.w_index = (int)f;
  }
  a.a_type = A_DOLLAR;
  binbuf_add((x->m_text).te_binbuf,1,&a);
  glist_retext(x->m_glist,&x->m_text);
  return;
}

Assistant:

static void message_adddollar(t_message *x, t_floatarg f)
{
    t_atom a;
    int n = f;
    if (n < 0)
        n = 0;
    SETDOLLAR(&a, n);
    binbuf_add(x->m_text.te_binbuf, 1, &a);
    glist_retext(x->m_glist, &x->m_text);
}